

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,
          back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *it)

{
  basic_string_view<char> sep;
  add_thousands_sep<char> sep_00;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> bVar1;
  unsigned_long *in_RSI;
  size_t in_RDI;
  undefined8 unaff_retaddr;
  basic_string_view<char> s;
  int in_stack_ffffffffffffffcc;
  unsigned_long value;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> in_stack_ffffffffffffffd8;
  basic_string_view<char> local_20;
  
  basic_string_view<char>::basic_string_view(&local_20,(char *)(in_RDI + 0xc),1);
  value = *in_RSI;
  sep.size_ = local_20.size_;
  sep.data_ = local_20.data_;
  internal::add_thousands_sep<char>::add_thousands_sep
            ((add_thousands_sep<char> *)&stack0xffffffffffffffb8,sep);
  sep_00.sep_.size_ = in_RDI;
  sep_00.sep_.data_ = (char *)in_RSI;
  sep_00._16_8_ = unaff_retaddr;
  bVar1 = internal::
          format_decimal<char,unsigned_long,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,fmt::v5::internal::add_thousands_sep<char>>
                    (in_stack_ffffffffffffffd8,value,in_stack_ffffffffffffffcc,sep_00);
  *in_RSI = (unsigned_long)bVar1.container;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }